

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiodevice.cpp
# Opt level: O1

QString * __thiscall QIODevice::errorString(QString *__return_storage_ptr__,QIODevice *this)

{
  QObjectData *pQVar1;
  QDynamicMetaObjectData *pQVar2;
  Data *pDVar3;
  
  pQVar1 = (this->super_QObject).d_ptr.d;
  pQVar2 = pQVar1[4].metaObject;
  if (pQVar2 == (QDynamicMetaObjectData *)0x0) {
    QMetaObject::tr(__return_storage_ptr__,&staticMetaObject,"Unknown error",(char *)0x0,-1);
  }
  else {
    pDVar3 = (Data *)pQVar1[4].children.d.size;
    (__return_storage_ptr__->d).d = pDVar3;
    (__return_storage_ptr__->d).ptr = *(char16_t **)&pQVar1[4].field_0x30;
    (__return_storage_ptr__->d).size = (qsizetype)pQVar2;
    if (pDVar3 != (Data *)0x0) {
      LOCK();
      (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QString QIODevice::errorString() const
{
    Q_D(const QIODevice);
    if (d->errorString.isEmpty()) {
#ifdef QT_NO_QOBJECT
        return QLatin1StringView(QT_TRANSLATE_NOOP(QIODevice, "Unknown error"));
#else
        return tr("Unknown error");
#endif
    }
    return d->errorString;
}